

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O0

void Assimp::FBX::Util::DOMError(string *message,Token *token)

{
  DeadlyImportError *this;
  allocator local_59;
  string local_58;
  string local_38;
  Token *local_18;
  Token *token_local;
  string *message_local;
  
  local_18 = token;
  token_local = (Token *)message;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"FBX-DOM",&local_59);
  AddTokenText(&local_38,&local_58,(string *)token_local,local_18);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void DOMError(const std::string& message, const Token& token)
{
    throw DeadlyImportError(Util::AddTokenText("FBX-DOM",message,&token));
}